

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O3

void __thiscall asmjit::v1_14::ZoneBitVector::release(ZoneBitVector *this,ZoneAllocator *allocator)

{
  int *piVar1;
  byte bVar2;
  undefined8 *puVar3;
  Error EVar4;
  ZoneAllocator *pZVar5;
  undefined1 *puVar6;
  ulong uVar7;
  undefined8 *in_RCX;
  ZoneAllocator *pZVar8;
  long *plVar9;
  long *plVar10;
  uint uVar11;
  undefined4 extraout_EDX;
  ulong uVar12;
  undefined8 *extraout_RDX;
  ZoneAllocator *pZVar13;
  ZoneAllocator *pZVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  ZoneVectorBase *unaff_RBX;
  ulong unaff_RBP;
  long *plVar19;
  long *plVar20;
  uint uVar21;
  uint *puVar22;
  undefined2 uVar23;
  uint *in_R8;
  uint *puVar24;
  ulong uVar25;
  long lVar26;
  long *plVar27;
  ZoneAllocator *pZVar28;
  long lVar29;
  long *plVar30;
  uint uVar31;
  ulong uVar32;
  ZoneVectorBase *this_00;
  bool bVar33;
  long *plStack_4d8;
  ulong uStack_4d0;
  ZoneVectorBase ZStack_4c8;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 uStack_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  uint *puStack_c0;
  ulong uStack_b8;
  size_t sStack_88;
  ZoneVectorBase *pZStack_80;
  undefined8 *puStack_68;
  code *pcStack_60;
  ZoneAllocator *pZStack_58;
  ZoneAllocator *pZStack_50;
  ZoneVectorBase *pZStack_48;
  
  puVar3 = *(undefined8 **)this;
  if (puVar3 == (undefined8 *)0x0) {
    return;
  }
  if (*(long *)allocator == 0) {
    release();
  }
  else {
    uVar11 = *(uint *)(this + 0xc);
    in_RCX = (undefined8 *)(ulong)uVar11;
    unaff_RBX = (ZoneVectorBase *)this;
    if (7 < uVar11) {
      uVar12 = (ulong)(uVar11 >> 3);
      if (uVar11 < 0x1008) {
        if (uVar11 < 0x408) {
          uVar12 = uVar12 + 0x1fffffffff >> 5;
        }
        else {
          uVar12 = (uVar12 + 0x3fffffff7f >> 6) + 4;
        }
        *puVar3 = *(undefined8 *)(allocator + (uVar12 & 0xffffffff) * 8 + 8);
        *(undefined8 **)(allocator + (uVar12 & 0xffffffff) * 8 + 8) = puVar3;
      }
      else {
        ZoneAllocator::_releaseDynamic(allocator,puVar3,uVar12);
      }
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      return;
    }
  }
  release();
  if (((ZoneVectorBase *)this)->_data == (void *)0x0) {
    ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  }
  else {
    lVar15 = *(long *)&((ZoneVectorBase *)this)->_size;
    in_RCX = *(undefined8 **)(lVar15 + 0x10);
    if (in_RCX != *(undefined8 **)((long)((ZoneVectorBase *)((long)this + 0x10))->_data + 0x18)) {
      if (in_RCX != *(undefined8 **)(lVar15 + 0x18)) {
        *(undefined8 **)(lVar15 + 0x10) = in_RCX + 1;
        if (in_RCX + 1 == *(undefined8 **)(lVar15 + 0x18)) {
          ZoneStackBase::_cleanupBlock((ZoneStackBase *)this,0,0x110);
        }
        return;
      }
      goto LAB_00128da3;
    }
  }
  ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
LAB_00128da3:
  ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  puVar3 = (undefined8 *)((ZoneVectorBase *)this)->_data;
  if (puVar3 == (undefined8 *)0x0) {
    return;
  }
  if (*(long *)allocator == 0) {
    ZoneVector<unsigned_int>::release();
  }
  else {
    uVar11 = ((ZoneVectorBase *)this)->_capacity << 2;
    uVar12 = (ulong)uVar11;
    unaff_RBX = (ZoneVectorBase *)this;
    if (uVar12 != 0) {
      if (uVar11 < 0x201) {
        if (uVar11 < 0x81) {
          uVar12 = uVar12 + 0x1fffffffff >> 5;
        }
        else {
          uVar12 = (uVar12 + 0x3fffffff7f >> 6) + 4;
        }
        *puVar3 = *(undefined8 *)(allocator + (uVar12 & 0xffffffff) * 8 + 8);
        *(undefined8 **)(allocator + (uVar12 & 0xffffffff) * 8 + 8) = puVar3;
      }
      else {
        ZoneAllocator::_releaseDynamic(allocator,puVar3,uVar12);
      }
      ((ZoneVectorBase *)this)->_data = (void *)0x0;
      ((ZoneVectorBase *)this)->_size = 0;
      ((ZoneVectorBase *)this)->_capacity = 0;
      return;
    }
  }
  ZoneVector<unsigned_int>::release();
  if (allocator < (ZoneAllocator *)(ulong)((ZoneVectorBase *)this)->_size) {
    return;
  }
  ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
  uVar31 = *(uint *)(extraout_RDX + 1);
  uVar18 = *(uint *)(in_RCX + 1);
  uVar11 = uVar18 + uVar31;
  pZStack_48 = unaff_RBX;
  if (((ZoneVectorBase *)this)->_capacity < uVar11) goto LAB_00128f8c;
  do {
    pZVar8 = (ZoneAllocator *)((ZoneVectorBase *)this)->_data;
    puVar22 = (uint *)*extraout_RDX;
    pZVar14 = (ZoneAllocator *)*in_RCX;
    puVar24 = puVar22 + (ulong)uVar31 * 3;
    allocator = pZVar14 + (ulong)uVar18 * 0xc;
    pZVar5 = pZVar8;
    if (uVar18 != 0 && uVar31 != 0) {
      uVar11 = *puVar22;
      pZVar13 = pZVar14;
      pZVar28 = pZVar8;
      do {
        while (uVar31 = *(uint *)(pZVar13 + 4), uVar11 < uVar31) {
          uVar11 = *(uint *)pZVar13;
          while (uVar31 = puVar22[1], uVar31 <= uVar11) {
            pZVar5 = pZVar28 + 0xc;
            unaff_RBP = (ulong)*puVar22;
            *(uint *)pZVar28 = *puVar22;
            *(uint *)(pZVar28 + 4) = uVar31;
            *(uint *)(pZVar28 + 8) = puVar22[2];
            puVar22 = puVar22 + 3;
            pZVar14 = pZVar13;
            pZVar28 = pZVar5;
            if (puVar22 == puVar24) goto LAB_00128f35;
          }
          uVar11 = *puVar22;
          if (uVar11 < *(uint *)(pZVar13 + 4)) {
            return;
          }
        }
        *(uint *)pZVar28 = *(uint *)pZVar13;
        *(uint *)(pZVar28 + 4) = uVar31;
        *(uint *)(pZVar28 + 8) = *in_R8;
        pZVar28 = pZVar28 + 0xc;
        pZVar13 = pZVar13 + 0xc;
        pZVar14 = allocator;
        pZVar5 = pZVar28;
      } while (pZVar13 != allocator);
    }
    for (; puVar22 != puVar24; puVar22 = puVar22 + 3) {
      *(long *)pZVar5 = *(long *)puVar22;
      *(uint *)(pZVar5 + 8) = puVar22[2];
      pZVar5 = pZVar5 + 0xc;
    }
LAB_00128f35:
    if (pZVar14 != allocator) {
      uVar11 = *in_R8;
      puVar22 = (uint *)(ulong)uVar11;
      do {
        puVar24 = *(uint **)pZVar14;
        *(uint **)pZVar5 = puVar24;
        *(uint *)(pZVar5 + 8) = uVar11;
        pZVar5 = pZVar5 + 0xc;
        pZVar14 = pZVar14 + 0xc;
      } while (pZVar14 != allocator);
    }
    uVar23 = SUB82(puVar24,0);
    if (pZVar8 <= pZVar5) {
      allocator = pZVar8 + (ulong)((ZoneVectorBase *)this)->_capacity * 0xc;
      if (pZVar5 <= allocator) {
        uVar11 = (int)((ulong)((long)pZVar5 - (long)pZVar8) >> 2) * -0x55555555;
        if (uVar11 <= ((ZoneVectorBase *)this)->_capacity) {
          ((ZoneVectorBase *)this)->_size = uVar11;
          return;
        }
        pZStack_50 = (ZoneAllocator *)ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[];
        RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
        uVar11 = (uint)pZVar8;
        pZStack_50 = (ZoneAllocator *)(ulong)puVar22[2];
        if (allocator < pZStack_50) {
          return;
        }
        pZStack_58 = (ZoneAllocator *)0x128fc9;
        ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
        pZStack_58 = (ZoneAllocator *)(ulong)puVar22[2];
        if (allocator < pZStack_58) {
          return;
        }
        pcStack_60 = RAStackAllocator::newSlot;
        ZoneVector<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::operator[]();
        pZStack_80 = (ZoneVectorBase *)this;
        puStack_68 = in_RCX;
        pcStack_60 = (code *)unaff_RBP;
        if ((puVar22[9] == puVar22[8]) &&
           (EVar4 = ZoneVectorBase::_grow
                              ((ZoneVectorBase *)(puVar22 + 6),*(ZoneAllocator **)puVar22,8,1),
           EVar4 != 0)) {
          return;
        }
        pZVar5 = *(ZoneAllocator **)puVar22;
        if (*(long *)pZVar5 == 0) {
          RAStackAllocator::newSlot();
        }
        else {
          puVar6 = (undefined1 *)ZoneAllocator::_alloc(pZVar5,0x14,&sStack_88);
          if (puVar6 == (undefined1 *)0x0) {
            return;
          }
          *puVar6 = (char)((ulong)allocator & 0xffffffff);
          puVar6[1] = (char)uVar11 + (uVar11 == 0);
          *(undefined2 *)(puVar6 + 2) = uVar23;
          *(undefined4 *)(puVar6 + 8) = 0;
          *(undefined4 *)(puVar6 + 4) = extraout_EDX;
          *(undefined8 *)(puVar6 + 0xc) = 0;
          if (uVar11 < puVar22[4]) {
            uVar11 = puVar22[4];
          }
          puVar22[4] = uVar11;
          if (puVar22[8] < puVar22[9]) {
            *(undefined1 **)(*(long *)(puVar22 + 6) + (ulong)puVar22[8] * 8) = puVar6;
            puVar22[8] = puVar22[8] + 1;
            return;
          }
        }
        RAStackAllocator::newSlot();
        uStack_b8 = (ulong)allocator & 0xffffffff;
        puStack_c0 = puVar22;
        plVar9 = *(long **)(pZVar5 + 0x18);
        uVar12 = (ulong)*(uint *)(pZVar5 + 0x20);
        if (uVar12 == 0) goto LAB_0012912a;
        plVar19 = (long *)0x0;
        break;
      }
    }
    pZStack_50 = (ZoneAllocator *)0x128f8c;
    RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
    uVar11 = (uint)pZVar8;
LAB_00128f8c:
    pZStack_50 = (ZoneAllocator *)0x128f99;
    EVar4 = ZoneVectorBase::_growingReserve((ZoneVectorBase *)this,allocator,0xc,uVar11);
    if (EVar4 != 0) {
      return;
    }
    uVar31 = *(uint *)(extraout_RDX + 1);
    uVar18 = *(uint *)(in_RCX + 1);
  } while( true );
  while( true ) {
    uVar11 = 0;
    if (bVar2 != 0) {
      for (; (bVar2 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    uVar31 = 6;
    if ((char)uVar11 != '\a') {
      uVar31 = uVar11;
    }
    if ((*(byte *)(lVar15 + 2) & 1) == 0) {
      uVar25 = (ulong)(uVar31 & 0xff);
    }
    else {
      uVar25 = (ulong)(byte)((byte)uVar31 ^ 7) * (ulong)*(uint *)(lVar15 + 8) + 0x10;
    }
    if (0xfffffffe < uVar25) {
      uVar25 = 0xffffffff;
    }
    *(int *)(lVar15 + 0xc) = (int)uVar25;
    plVar19 = plVar19 + 1;
    if (uVar12 * 8 - (long)plVar19 == 0) break;
    lVar15 = *(long *)((long)plVar9 + (long)plVar19);
    bVar2 = *(byte *)(lVar15 + 1);
    if (bVar2 == 0) goto LAB_00129481;
  }
LAB_0012912a:
  lVar15 = 0;
  plVar19 = plVar9 + uVar12;
LAB_00129130:
  do {
    uVar25 = (long)plVar19 - (long)plVar9 >> 3;
    if (7 < uVar25) {
      plVar20 = plVar19 + -1;
      lVar29 = *(long *)((long)plVar9 + (uVar25 & 0xfffffffffffffffe) * 4);
      *(long *)((long)plVar9 + (uVar25 & 0xfffffffffffffffe) * 4) = *plVar9;
      *plVar9 = lVar29;
      lVar16 = plVar9[1];
      lVar26 = plVar19[-1];
      uVar11 = *(uint *)(lVar16 + 0xc);
      uVar31 = *(uint *)(lVar26 + 0xc);
      if (uVar31 < uVar11) {
        plVar9[1] = lVar26;
        *plVar20 = lVar16;
        lVar29 = *plVar9;
        lVar26 = lVar16;
        uVar31 = uVar11;
      }
      uVar11 = *(uint *)(lVar29 + 0xc);
      if (uVar31 < uVar11) {
        *plVar9 = lVar26;
        *plVar20 = lVar29;
        lVar29 = *plVar9;
        uVar11 = *(uint *)(lVar29 + 0xc);
      }
      plVar27 = plVar9 + 1;
      lVar16 = *plVar27;
      if (uVar11 < *(uint *)(lVar16 + 0xc)) {
        plVar9[1] = lVar29;
        *plVar9 = lVar16;
      }
LAB_00129218:
      if (plVar27 < plVar20) break;
      goto LAB_00129232;
    }
    if ((plVar9 != plVar19) && (1 < uVar25)) {
      plVar20 = plVar9 + 1;
      do {
        if (plVar9 < plVar20) {
          lVar16 = *plVar20;
          uVar11 = *(uint *)(lVar16 + 0xc);
          plVar27 = plVar20;
          do {
            lVar26 = plVar27[-1];
            if (*(uint *)(lVar26 + 0xc) <= uVar11) break;
            plVar27[-1] = lVar16;
            *plVar27 = lVar26;
            plVar27 = plVar27 + -1;
          } while (plVar9 < plVar27);
        }
        plVar20 = plVar20 + 1;
      } while (plVar20 < (long *)(((long)plVar19 - (long)plVar9) + (long)plVar9));
    }
    if (lVar15 == 0) {
      uStack_478 = 0;
      uStack_470 = 0;
      uStack_488 = 0;
      uStack_480 = 0;
      uStack_498 = 0;
      uStack_490 = 0;
      uStack_4a8 = 0;
      uStack_4a0 = 0;
      uStack_4b8 = 0;
      uStack_4b0 = 0;
      ZStack_4c8._data = (void *)0x0;
      ZStack_4c8._size = 0;
      ZStack_4c8._capacity = 0;
      if (uVar12 != 0) {
        plVar19 = *(long **)(pZVar5 + 0x18);
        plVar9 = plVar19 + uVar12;
        uVar12 = 0;
        goto LAB_001292e2;
      }
      iVar17 = -1;
      goto LAB_0012945a;
    }
    plVar9 = *(long **)((long)&plStack_4d8 + lVar15);
    plVar19 = *(long **)((long)&uStack_4d0 + lVar15);
    lVar15 = lVar15 + -0x10;
  } while( true );
  plVar10 = plVar27 + 1;
  plVar27 = plVar27 + 1;
  if (*(uint *)(*plVar10 + 0xc) < *(uint *)(*plVar9 + 0xc)) goto LAB_00129218;
LAB_00129232:
  do {
    if (plVar20 <= plVar9) break;
    plVar10 = plVar20 + -1;
    plVar20 = plVar20 + -1;
  } while (*(uint *)(*plVar9 + 0xc) < *(uint *)(*plVar10 + 0xc));
  if (plVar27 <= plVar20) {
    lVar16 = *plVar27;
    *plVar27 = *plVar20;
    *plVar20 = lVar16;
    goto LAB_00129218;
  }
  lVar16 = *plVar9;
  *plVar9 = *plVar20;
  *plVar20 = lVar16;
  plVar10 = plVar9;
  plVar30 = plVar19;
  if ((long)plVar19 - (long)plVar27 < (long)plVar20 - (long)plVar9) {
    plVar10 = plVar27;
    plVar27 = plVar9;
    plVar30 = plVar20;
    plVar20 = plVar19;
  }
  *(long **)((long)&ZStack_4c8._data + lVar15) = plVar27;
  *(long **)((long)&ZStack_4c8._size + lVar15) = plVar30;
  if (0x3f0 < lVar15) goto LAB_0012947c;
  lVar15 = lVar15 + 0x10;
  plVar9 = plVar10;
  plVar19 = plVar20;
  goto LAB_00129130;
LAB_001292e2:
  lVar15 = *plVar19;
  if ((*(byte *)(lVar15 + 2) & 2) == 0) {
    bVar2 = *(byte *)(lVar15 + 1);
    uVar31 = -(uint)bVar2 & ((int)uVar12 + (uint)bVar2) - 1;
    uVar11 = *(uint *)(lVar15 + 4);
    uVar25 = (ulong)uVar11;
    if (uVar11 < 0x40) {
      iVar17 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      uVar7 = (ulong)(uint)(iVar17 << 4) | 8;
      do {
        iVar17 = *(int *)((long)&ZStack_4c8._data + uVar7);
        if (iVar17 != 0) {
          uVar21 = iVar17 - 1;
          pZVar8 = (ZoneAllocator *)(ulong)uVar21;
          *(uint *)((long)&ZStack_4c8._data + uVar7) = uVar21;
          uVar18 = *(uint *)(*(long *)((long)&uStack_4d0 + uVar7) + (long)pZVar8 * 8);
          if (uVar18 % (uint)bVar2 != 0) goto LAB_0012948b;
          iVar17 = *(int *)(*(long *)((long)&uStack_4d0 + uVar7) + 4 + (long)pZVar8 * 8);
          *(uint *)(lVar15 + 0x10) = uVar18;
          iVar17 = iVar17 - uVar11;
          uVar7 = (ulong)(uVar18 - uVar11);
          bVar33 = true;
          pZVar8 = (ZoneAllocator *)CONCAT71((uint7)(uint3)(uVar21 >> 8),1);
          goto LAB_00129369;
        }
        uVar7 = uVar7 + 0x10;
      } while (uVar7 != 0x68);
    }
    iVar17 = uVar31 - (int)uVar12;
    bVar33 = iVar17 == 0;
    uVar7 = 0;
    pZVar8 = (ZoneAllocator *)0x0;
    uVar12 = (ulong)uVar31;
LAB_00129369:
    if (iVar17 != 0) {
      uVar32 = (ulong)uVar31;
      if (bVar33) {
        uVar32 = uVar7;
      }
      uVar31 = (uint)uVar32;
      uVar18 = iVar17 + uVar31;
      while (uVar11 = (uint)uVar25, uVar31 < uVar18) {
        iVar17 = 0;
        uVar21 = (uint)uVar32;
        if (uVar21 != 0) {
          for (; (uVar21 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
          }
        }
        uVar31 = 1 << ((byte)iVar17 & 0x1f);
        if (uVar18 - uVar21 < uVar31) break;
        uVar7 = (ulong)(uint)(iVar17 << 4);
        this_00 = (ZoneVectorBase *)((long)&ZStack_4c8._data + uVar7);
        uVar11 = *(uint *)((long)&ZStack_4c8._size + uVar7);
        if (uVar11 == *(uint *)((long)&ZStack_4c8._capacity + uVar7)) {
          plStack_4d8 = plVar9;
          uStack_4d0 = uVar12;
          EVar4 = ZoneVectorBase::_grow(this_00,*(ZoneAllocator **)pZVar5,8,1);
          if (EVar4 != 0) {
            return;
          }
          uVar11 = *(uint *)((long)&ZStack_4c8._size + uVar7);
          uVar12 = uStack_4d0;
          plVar9 = plStack_4d8;
        }
        uVar25 = uVar32 | (ulong)uVar31 << 0x20;
        *(ulong *)((long)this_00->_data + (ulong)uVar11 * 8) = uVar25;
        piVar1 = (int *)((long)&ZStack_4c8._size + uVar7);
        *piVar1 = *piVar1 + 1;
        uVar31 = uVar31 + uVar21;
        uVar32 = (ulong)uVar31;
      }
    }
    if ((char)pZVar8 == '\0') {
      if ((int)((uVar12 & 0xffffffff) % (ulong)bVar2) != 0) goto LAB_00129486;
      *(int *)(lVar15 + 0x10) = (int)uVar12;
      uVar12 = (ulong)(uint)((int)uVar12 + *(int *)(lVar15 + 4));
    }
  }
  plVar19 = plVar19 + 1;
  if (plVar19 == plVar9) {
    iVar17 = (int)uVar12 + -1;
LAB_0012945a:
    *(int *)(pZVar5 + 0xc) = -*(int *)(pZVar5 + 0x10) & iVar17 + *(int *)(pZVar5 + 0x10);
    return;
  }
  goto LAB_001292e2;
LAB_0012947c:
  RAStackAllocator::calculateStackFrame();
LAB_00129481:
  uVar11 = (uint)plVar19;
  RAStackAllocator::calculateStackFrame();
  pZVar8 = pZVar5;
LAB_00129486:
  RAStackAllocator::calculateStackFrame();
LAB_0012948b:
  RAStackAllocator::calculateStackFrame();
  uVar31 = *(uint *)(pZVar8 + 0x20);
  if ((ulong)uVar31 != 0) {
    lVar15 = *(long *)(pZVar8 + 0x18);
    lVar16 = 0;
    do {
      if ((*(byte *)(*(long *)(lVar15 + lVar16) + 2) & 2) == 0) {
        piVar1 = (int *)(*(long *)(lVar15 + lVar16) + 0x10);
        *piVar1 = *piVar1 + uVar11;
      }
      lVar16 = lVar16 + 8;
    } while ((ulong)uVar31 << 3 != lVar16);
  }
  return;
}

Assistant:

inline void release(ZoneAllocator* allocator) noexcept {
    if (!_data)
      return;
    allocator->release(_data, _capacity / 8);
    reset();
  }